

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void luaH_finishset(lua_State *L,Table *t,TValue *key,TValue *value,int hres)

{
  lua_Number n;
  Node *pNVar1;
  int iVar2;
  char *fmt;
  lua_Integer k;
  TValue aux;
  Value local_38;
  Value local_30;
  undefined1 local_28;
  
  if (hres == 1) {
    if ((key->tt_ & 0xf) == 0) {
      fmt = "table index is nil";
LAB_0011ca8d:
      luaG_runerror(L,fmt);
    }
    if (key->tt_ == 0x13) {
      n = (key->value_).n;
      iVar2 = luaV_flttointeger(n,&local_38.i,F2Ieq);
      if (iVar2 == 0) {
        if (NAN(n)) {
          fmt = "table index is NaN";
          goto LAB_0011ca8d;
        }
      }
      else {
        key = (TValue *)&local_30;
        local_30 = local_38;
        local_28 = 3;
      }
    }
    luaH_newkey(L,t,key,value);
  }
  else if (hres < 1) {
    *(lu_byte *)((long)t->array + (ulong)(uint)~hres + 4) = value->tt_;
    t->array[-1 - (ulong)(uint)~hres] = value->value_;
  }
  else {
    pNVar1 = t->node;
    pNVar1[(ulong)(uint)hres - 3].u.value_ = value->value_;
    *(lu_byte *)((long)pNVar1 + (ulong)(uint)hres * 0x18 + -0x40) = value->tt_;
  }
  return;
}

Assistant:

void luaH_finishset (lua_State *L, Table *t, const TValue *key,
                                    TValue *value, int hres) {
  lua_assert(hres != HOK);
  if (hres == HNOTFOUND) {
    TValue aux;
    if (l_unlikely(ttisnil(key)))
      luaG_runerror(L, "table index is nil");
    else if (ttisfloat(key)) {
      lua_Number f = fltvalue(key);
      lua_Integer k;
      if (luaV_flttointeger(f, &k, F2Ieq)) {
        setivalue(&aux, k);  /* key is equal to an integer */
        key = &aux;  /* insert it as an integer */
      }
      else if (l_unlikely(luai_numisnan(f)))
        luaG_runerror(L, "table index is NaN");
    }
    luaH_newkey(L, t, key, value);
  }
  else if (hres > 0) {  /* regular Node? */
    setobj2t(L, gval(gnode(t, hres - HFIRSTNODE)), value);
  }
  else {  /* array entry */
    hres = ~hres;  /* real index */
    obj2arr(t, cast_uint(hres), value);
  }
}